

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::DecimalRoundNegativePrecisionFunction<long,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  long lVar2;
  long lVar3;
  idx_t count;
  long *plVar4;
  long *plVar5;
  unsigned_long *puVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  byte bVar10;
  byte bVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  const_reference pvVar14;
  pointer pEVar15;
  long lVar16;
  reference vector;
  long lVar17;
  ulong uVar18;
  idx_t iVar19;
  idx_t i_2;
  idx_t entry_idx;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  idx_t i_1;
  idx_t iVar23;
  ulong uVar24;
  UnifiedVectorFormat local_78;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar12->bind_info);
  pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar12->children,0);
  pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar14);
  bVar10 = DecimalType::GetScale(&pEVar15->return_type);
  pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar12->children,0);
  pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar14);
  bVar11 = DecimalType::GetWidth(&pEVar15->return_type);
  iVar1 = *(int *)&pFVar13[1]._vptr_FunctionData;
  if ((int)((uint)bVar10 - (uint)bVar11) < iVar1) {
    lVar2 = *(long *)(NumericHelper::POWERS_OF_TEN + (long)(int)((uint)bVar10 - iVar1) * 8);
    lVar3 = *(long *)(NumericHelper::POWERS_OF_TEN + (long)iVar1 * -8);
    lVar16 = lVar2 / 2;
    vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    count = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      pdVar7 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar23 = 0; count != iVar23; iVar23 = iVar23 + 1) {
          lVar17 = lVar16;
          if (*(long *)(pdVar7 + iVar23 * 8) < 0) {
            lVar17 = -lVar16;
          }
          *(long *)(pdVar9 + iVar23 * 8) =
               ((lVar17 + *(long *)(pdVar7 + iVar23 * 8)) / lVar2) * lVar3;
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::Initialize
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
        puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar21 = 0;
        for (uVar20 = 0; uVar20 != count + 0x3f >> 6; uVar20 = uVar20 + 1) {
          if (puVar6 == (unsigned_long *)0x0) {
            uVar22 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar22 = count;
            }
LAB_01e2c036:
            for (; uVar18 = uVar21, uVar21 < uVar22; uVar21 = uVar21 + 1) {
              lVar17 = lVar16;
              if (*(long *)(pdVar7 + uVar21 * 8) < 0) {
                lVar17 = -lVar16;
              }
              *(long *)(pdVar9 + uVar21 * 8) =
                   ((lVar17 + *(long *)(pdVar7 + uVar21 * 8)) / lVar2) * lVar3;
            }
          }
          else {
            uVar8 = puVar6[uVar20];
            uVar22 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar22 = count;
            }
            if (uVar8 == 0xffffffffffffffff) goto LAB_01e2c036;
            uVar18 = uVar22;
            if (uVar8 != 0) {
              for (uVar24 = 0; uVar18 = uVar21 + uVar24, uVar21 + uVar24 < uVar22;
                  uVar24 = uVar24 + 1) {
                if ((uVar8 >> (uVar24 & 0x3f) & 1) != 0) {
                  lVar17 = lVar16;
                  if (*(long *)(pdVar7 + uVar24 * 8 + uVar21 * 8) < 0) {
                    lVar17 = -lVar16;
                  }
                  *(long *)(pdVar9 + uVar24 * 8 + uVar21 * 8) =
                       ((lVar17 + *(long *)(pdVar7 + uVar24 * 8 + uVar21 * 8)) / lVar2) * lVar3;
                }
              }
            }
          }
          uVar21 = uVar18;
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      plVar4 = (long *)result->data;
      plVar5 = (long *)vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      lVar17 = -lVar16;
      if (-1 < *plVar5) {
        lVar17 = lVar16;
      }
      *plVar4 = ((lVar17 + *plVar5) / lVar2) * lVar3;
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar23 = 0; count != iVar23; iVar23 = iVar23 + 1) {
          iVar19 = iVar23;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar19 = (idx_t)(local_78.sel)->sel_vector[iVar23];
          }
          lVar17 = lVar16;
          if (*(long *)(local_78.data + iVar19 * 8) < 0) {
            lVar17 = -lVar16;
          }
          *(long *)(pdVar9 + iVar23 * 8) =
               ((lVar17 + *(long *)(local_78.data + iVar19 * 8)) / lVar2) * lVar3;
        }
      }
      else {
        for (iVar23 = 0; count != iVar23; iVar23 = iVar23 + 1) {
          iVar19 = iVar23;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar19 = (idx_t)(local_78.sel)->sel_vector[iVar23];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar19 >> 6] >> (iVar19 & 0x3f) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar23);
          }
          else {
            lVar17 = lVar16;
            if (*(long *)(local_78.data + iVar19 * 8) < 0) {
              lVar17 = -lVar16;
            }
            *(long *)(pdVar9 + iVar23 * 8) =
                 ((lVar17 + *(long *)(local_78.data + iVar19 * 8)) / lVar2) * lVar3;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_78,0);
    Vector::SetValue(result,0,(Value *)&local_78);
    Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}